

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  BumpAllocator *alloc;
  undefined1 auVar1 [8];
  bool bVar2;
  UnconnectedDriveDirectiveSyntax *syntax;
  Token TVar3;
  UnconnectedDriveDirectiveSyntax *result;
  SourceLocation local_b0;
  Token local_a8;
  Token local_98;
  SourceLocation local_88;
  DiagCode local_7c;
  Token local_78;
  Token local_68;
  undefined1 local_58 [8];
  Token strength;
  Preprocessor *this_local;
  Token directive_local;
  
  directive_local._0_8_ = directive.info;
  strength.info = directive._0_8_;
  this_local = (Preprocessor *)strength.info;
  checkOutsideDesignElement(this,directive);
  Token::Token((Token *)local_58);
  local_68 = peek(this);
  if (local_68.kind == Pull0Keyword || local_68.kind == Pull1Keyword) {
    TVar3 = consume(this);
    local_78._0_8_ = TVar3._0_8_;
    local_58._0_2_ = local_78.kind;
    local_58[2] = local_78._2_1_;
    local_58[3] = local_78.numFlags.raw;
    local_58._4_4_ = local_78.rawLen;
    auVar1 = local_58;
    local_78.info = TVar3.info;
    strength._0_8_ = local_78.info;
    local_58._0_2_ = TVar3.kind;
    this->unconnectedDrive = local_58._0_2_;
    local_78 = TVar3;
    local_58 = auVar1;
  }
  bVar2 = Token::operator_cast_to_bool((Token *)local_58);
  if (!bVar2) {
    local_7c.subsystem = Preprocessor;
    local_7c.code = 3;
    local_98 = peek(this);
    local_88 = Token::location(&local_98);
    addDiag(this,local_7c,local_88);
    alloc = this->alloc;
    _result = peek(this);
    local_b0 = Token::location((Token *)&result);
    TVar3 = Token::createMissing(alloc,Pull0Keyword,local_b0);
    local_a8._0_8_ = TVar3._0_8_;
    local_58._0_2_ = local_a8.kind;
    local_58[2] = local_a8._2_1_;
    local_58[3] = local_a8.numFlags.raw;
    local_58._4_4_ = local_a8.rawLen;
    local_a8.info = TVar3.info;
    strength._0_8_ = local_a8.info;
    local_a8 = TVar3;
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,(Token *)&this_local,(Token *)local_58);
  Trivia::Trivia((Trivia *)&directive_local.info,Directive,(SyntaxNode *)syntax);
  return stack0xffffffffffffffe8;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        addDiag(diag::ExpectedDriveStrength, peek().location());
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, peek().location());
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}